

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

int replay_display_menu(nh_menuitem *items,int icount,char *title,int how,int *results)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  nh_menuitem *pnVar5;
  long lVar6;
  int val;
  int local_3c;
  int *local_38;
  
  if (how == 0) {
    lVar6 = 0;
  }
  else {
    local_38 = results;
    pcVar3 = next_log_token();
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'm')) {
      parse_error("Bad menu data");
    }
    lVar6 = 0xffffffff;
    if (pcVar3[2] != 'x') {
      pcVar3 = pcVar3 + 3;
      lVar6 = 0;
      iVar2 = __isoc99_sscanf(pcVar3,"%x:",&local_3c);
      if (iVar2 != 0) {
        lVar6 = 0;
        do {
          if (icount < 1) {
LAB_001b8c97:
            parse_error("Invalid menu id in menu data");
          }
          lVar4 = 1;
          bVar1 = false;
          pnVar5 = items;
          do {
            if (pnVar5->id == local_3c) {
              bVar1 = true;
            }
            if (icount <= lVar4) break;
            pnVar5 = pnVar5 + 1;
            lVar4 = lVar4 + 1;
          } while (!bVar1);
          if (!bVar1) goto LAB_001b8c97;
          local_38[lVar6] = local_3c;
          lVar6 = lVar6 + 1;
          pcVar3 = strchr(pcVar3,0x3a);
          pcVar3 = pcVar3 + 1;
          iVar2 = __isoc99_sscanf(pcVar3,"%x:",&local_3c);
        } while (iVar2 != 0);
      }
    }
  }
  return (int)lVar6;
}

Assistant:

static int replay_display_menu(struct nh_menuitem *items, int icount,
				const char *title, int how, int *results)
{
    int i, j, val;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'm')
	parse_error("Bad menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    while (sscanf(resultbuf, "%x:", &val)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == val)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in menu data");
	
	results[i++] = val;
	resultbuf = strchr(resultbuf, ':') + 1;
    }

    return i;
}